

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O1

void __thiscall fanuc_post_processor::generate_LS::First_Part(generate_LS *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  long *plVar4;
  uint uVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  uint __len;
  string __str;
  long *local_90;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->program_name_)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::operator+(&local_70,"COMMENT\t\t\t= ",&this->comment_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)this);
  std::operator+(&local_70,"PROG_SIZE\t\t= ",&this->prog_size_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)this);
  std::operator+(&local_70,"FILE_NAME\t\t= ",&this->file_name_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)this);
  std::operator+(&local_70,"VERSION\t\t\t= ",&this->version_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)this);
  uVar2 = this->line_cnt;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar5 = (uint)uVar8;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_00102ee1;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_00102ee1;
      }
      if (uVar5 < 10000) goto LAB_00102ee1;
      uVar8 = uVar8 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_00102ee1:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50[0] + (ulong)(uVar2 >> 0x1f)),__len,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x106112);
  paVar1 = &local_70.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_70.field_2._M_allocated_capacity = *psVar7;
    local_70.field_2._8_8_ = plVar4[3];
    local_70._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar7;
    local_70._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  std::__cxx11::string::append((char *)this);
  std::operator+(&local_70,"MEMORY_SIZE\t\t= ",&this->memory_size_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)this,(ulong)local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  std::__cxx11::string::append((char *)this);
  return;
}

Assistant:

void generate_LS::First_Part() {
        // PROG
        program.append("/PROG ");
        program.append(program_name_);
        program.append("\n");
        // ATTR
        program.append("/ATTR");
        program.append("\n");
        program.append("OWNER\t\t\t= MNEDITOR;");
        program.append("\n");
        program.append("COMMENT\t\t\t= " + comment_ +";");
        program.append("\n");
        program.append("PROG_SIZE\t\t= " + prog_size_ + ";");
        program.append("\n");
//        program.append("CREATE\t\t\t= DATE 21-03-18  TIME 13:17:58;");
//        program.append("\n");
//        program.append("MODIFIED\t\t= DATE 21-03-18  TIME 14:10:54;");
//        program.append("\n");
        program.append("FILE_NAME\t\t= " + file_name_ + ";");
        program.append("\n");
        program.append("VERSION\t\t\t= " + version_ + ";");
        program.append("\n");
        program.append("LINE_COUNT\t\t= " + std::to_string(line_cnt) + ";");
        program.append("\n");
        program.append("MEMORY_SIZE\t\t= " + memory_size_ + ";");
        program.append("\n");
        program.append("PROTECT\t\t\t= READ_WRITE;");
        program.append("\n");
        program.append("TCD:  STACK_SIZE\t\t= 0,\n"
                       "      TASK_PRIORITY\t\t= 50,\n"
                       "      TIME_SLICE\t\t= 0,\n"
                       "      BUSY_LAMP_OFF\t\t= 0,\n"
                       "      ABORT_REQUEST\t\t= 0,\n"
                       "      PAUSE_REQUEST\t\t= 0;");
        program.append("\n");
        program.append("DEFAULT_GROUP\t= 1,*,*,*,*;");
        program.append("\n");
        program.append("CONTROL_CODE\t= 00000000 00000000;");
        program.append("\n");

//        //APPL
//        program.append("/APPL\n");
//        program.append("  SPOT : TRUE ;");
//        program.append("\n");
//        program.append("\n");
//        program.append("AUTO_SINGULARITY_HEADER;");
//        program.append("\n");
//        program.append("  ENABLE_SINGULARITY_AVOIDANCE   : FALSE;");
//        program.append("\n");
//        program.append("  SPOT Welding Equipment Number : 1 ;");
//        program.append("\n");

        //MN
        program.append("/MN");
        program.append("\n");
        program.append("\t1:  UFRAME_NUM=0 ;");
        program.append("\n");
        program.append("\t2:  UTOOL_NUM=1 ;");
        program.append("\n");
    }